

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_internal.h
# Opt level: O2

h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> * __thiscall
AS_02::h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::FlushIndexPartition
          (h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *this)

{
  ui32_t uVar1;
  int64_t iVar2;
  long in_RSI;
  undefined **local_88;
  ui32_t local_80;
  ui64_t local_78;
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  uVar1 = MXF::AS02IndexWriterVBR::GetDuration((AS02IndexWriterVBR *)(in_RSI + 0x448));
  if (uVar1 != 0) {
    iVar2 = Kumu::IFileReader::TellPosition((IFileReader *)(in_RSI + 0x10));
    *(int64_t *)(in_RSI + 0x4d0) = iVar2;
    MXF::AS02IndexWriterVBR::WriteToFile
              ((AS02IndexWriterVBR *)&stack0xffffffffffffff78,(FileWriter *)(in_RSI + 0x448));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff78);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff78);
    local_78 = *(ui64_t *)(in_RSI + 0x4d0);
    local_88 = &PTR__IArchive_00168e48;
    local_80 = 0;
    std::__cxx11::
    list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::push_back
              ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)(in_RSI + 0x2e8),(value_type *)&stack0xffffffffffffff78);
  }
  return this;
}

Assistant:

Result_t FlushIndexPartition()
      {
          Result_t result = RESULT_OK;
	    if ( this->m_IndexWriter.GetDuration() > 0 )
	    {
	    this->m_IndexWriter.ThisPartition = this->m_File.TellPosition();
	    result = this->m_IndexWriter.WriteToFile(this->m_File);
	    this->m_RIP.PairArray.push_back(RIP::PartitionPair(0, this->m_IndexWriter.ThisPartition));
	    }
          return result;
      }